

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

ngx_int_t ngx_cmp_sockaddr(sockaddr *sa1,socklen_t slen1,sockaddr *sa2,socklen_t slen2,
                          ngx_uint_t cmp_port)

{
  sa_family_t sVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  ngx_int_t nVar4;
  undefined1 auVar5 [16];
  
  sVar1 = sa1->sa_family;
  nVar4 = -5;
  if (sVar1 == sa2->sa_family) {
    if (sVar1 == 1) {
      uVar3 = (ulong)slen2;
      if (slen1 < slen2) {
        uVar3 = (ulong)slen1;
      }
      __n = 0x6c;
      if (uVar3 - 2 < 0x6c) {
        __n = uVar3 - 2;
      }
      iVar2 = bcmp(sa1->sa_data,sa2->sa_data,__n);
      if (iVar2 != 0) {
        return -5;
      }
    }
    else if (sVar1 == 10) {
      if ((cmp_port != 0) && (*(short *)sa1->sa_data != *(short *)sa2->sa_data)) {
        return -5;
      }
      auVar5[0] = -(sa2->sa_data[6] == sa1->sa_data[6]);
      auVar5[1] = -(sa2->sa_data[7] == sa1->sa_data[7]);
      auVar5[2] = -(sa2->sa_data[8] == sa1->sa_data[8]);
      auVar5[3] = -(sa2->sa_data[9] == sa1->sa_data[9]);
      auVar5[4] = -(sa2->sa_data[10] == sa1->sa_data[10]);
      auVar5[5] = -(sa2->sa_data[0xb] == sa1->sa_data[0xb]);
      auVar5[6] = -(sa2->sa_data[0xc] == sa1->sa_data[0xc]);
      auVar5[7] = -(sa2->sa_data[0xd] == sa1->sa_data[0xd]);
      auVar5[8] = -((char)sa2[1].sa_family == (char)sa1[1].sa_family);
      auVar5[9] = -(*(char *)((long)&sa2[1].sa_family + 1) == *(char *)((long)&sa1[1].sa_family + 1)
                   );
      auVar5[10] = -(sa2[1].sa_data[0] == sa1[1].sa_data[0]);
      auVar5[0xb] = -(sa2[1].sa_data[1] == sa1[1].sa_data[1]);
      auVar5[0xc] = -(sa2[1].sa_data[2] == sa1[1].sa_data[2]);
      auVar5[0xd] = -(sa2[1].sa_data[3] == sa1[1].sa_data[3]);
      auVar5[0xe] = -(sa2[1].sa_data[4] == sa1[1].sa_data[4]);
      auVar5[0xf] = -(sa2[1].sa_data[5] == sa1[1].sa_data[5]);
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) != 0xffff) {
        return -5;
      }
    }
    else {
      if ((cmp_port != 0) && (*(short *)sa1->sa_data != *(short *)sa2->sa_data)) {
        return -5;
      }
      if (*(int *)(sa1->sa_data + 2) != *(int *)(sa2->sa_data + 2)) {
        return -5;
      }
    }
    nVar4 = 0;
  }
  return nVar4;
}

Assistant:

ngx_int_t
ngx_cmp_sockaddr(struct sockaddr *sa1, socklen_t slen1,
    struct sockaddr *sa2, socklen_t slen2, ngx_uint_t cmp_port)
{
    struct sockaddr_in   *sin1, *sin2;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6  *sin61, *sin62;
#endif
#if (NGX_HAVE_UNIX_DOMAIN)
    size_t                len;
    struct sockaddr_un   *saun1, *saun2;
#endif

    if (sa1->sa_family != sa2->sa_family) {
        return NGX_DECLINED;
    }

    switch (sa1->sa_family) {

#if (NGX_HAVE_INET6)
    case AF_INET6:

        sin61 = (struct sockaddr_in6 *) sa1;
        sin62 = (struct sockaddr_in6 *) sa2;

        if (cmp_port && sin61->sin6_port != sin62->sin6_port) {
            return NGX_DECLINED;
        }

        if (ngx_memcmp(&sin61->sin6_addr, &sin62->sin6_addr, 16) != 0) {
            return NGX_DECLINED;
        }

        break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
    case AF_UNIX:

        saun1 = (struct sockaddr_un *) sa1;
        saun2 = (struct sockaddr_un *) sa2;

        if (slen1 < slen2) {
            len = slen1 - offsetof(struct sockaddr_un, sun_path);

        } else {
            len = slen2 - offsetof(struct sockaddr_un, sun_path);
        }

        if (len > sizeof(saun1->sun_path)) {
            len = sizeof(saun1->sun_path);
        }

        if (ngx_memcmp(&saun1->sun_path, &saun2->sun_path, len) != 0) {
            return NGX_DECLINED;
        }

        break;
#endif

    default: /* AF_INET */

        sin1 = (struct sockaddr_in *) sa1;
        sin2 = (struct sockaddr_in *) sa2;

        if (cmp_port && sin1->sin_port != sin2->sin_port) {
            return NGX_DECLINED;
        }

        if (sin1->sin_addr.s_addr != sin2->sin_addr.s_addr) {
            return NGX_DECLINED;
        }

        break;
    }

    return NGX_OK;
}